

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_d2i_fp.cc
# Opt level: O2

void * ASN1_item_d2i_fp(ASN1_ITEM *it,FILE *in,void *x)

{
  BIO *in_00;
  void *pvVar1;
  
  in_00 = BIO_new_fp(in,0);
  if (in_00 == (BIO *)0x0) {
    ERR_put_error(0xc,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_d2i_fp.cc"
                  ,0x29);
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = ASN1_item_d2i_bio(it,in_00,x);
    BIO_free(in_00);
  }
  return pvVar1;
}

Assistant:

void *ASN1_item_d2i_fp(const ASN1_ITEM *it, FILE *in, void *x) {
  BIO *b = BIO_new_fp(in, BIO_NOCLOSE);
  if (b == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_BUF_LIB);
    return NULL;
  }
  void *ret = ASN1_item_d2i_bio(it, b, x);
  BIO_free(b);
  return ret;
}